

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O3

int __thiscall QuadraticFunctor::operator()(QuadraticFunctor *this,VectorXd *x,VectorXd *fvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  uVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (((0 < (long)uVar5) && (uVar5 != 1)) && (2 < uVar5)) {
    lVar6 = (this->measuredValues).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    if (((0 < lVar6) &&
        (lVar10 = (this->measuredValues).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
        0 < lVar10)) && (lVar10 != 1)) {
      pdVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      dVar1 = *pdVar7;
      dVar2 = pdVar7[1];
      dVar3 = pdVar7[2];
      pdVar7 = (this->measuredValues).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      pdVar8 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      lVar10 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
      lVar9 = 0;
      if (0 < lVar10) {
        lVar9 = lVar10;
      }
      lVar10 = 1;
      do {
        if (lVar10 - lVar9 == 1) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        dVar4 = pdVar7[lVar10 + -1];
        pdVar8[lVar10 + -1] =
             pdVar7[lVar6 + lVar10 + -1] - (dVar1 * dVar4 * dVar4 + dVar2 * dVar4 + dVar3);
        bVar11 = lVar10 != lVar6;
        lVar10 = lVar10 + 1;
      } while (bVar11);
    }
    __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<double, -1, -1>, Level = 0]"
                 );
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

int operator()(const Eigen::VectorXd &x, Eigen::VectorXd &fvec) const
    {
        // 'x' has dimensions n x 1
        // It contains the current estimates for the parameters.

        // 'fvec' has dimensions m x 1
        // It will contain the error for each data point.

        double aParam = x(0);
        double bParam = x(1);
        double cParam = x(2);

        for (int i = 0; i < values(); i++)
        {
            double xValue = measuredValues(i, 0);
            double yValue = measuredValues(i, 1);

            fvec(i) = yValue - (aParam * xValue * xValue + bParam * xValue + cParam);
        }
    }